

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

OBJ_AFFECT_DATA * new_affect_obj(void)

{
  OBJ_AFFECT_DATA *af;
  OBJ_AFFECT_DATA *local_8;
  
  if (oaffect_free == (OBJ_AFFECT_DATA *)0x0) {
    local_8 = (OBJ_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    local_8 = oaffect_free;
    oaffect_free = oaffect_free->next;
  }
  memcpy(local_8,&new_affect_obj::af_zero,0x50);
  local_8->valid = true;
  return local_8;
}

Assistant:

OBJ_AFFECT_DATA *new_affect_obj(void)
{
	static OBJ_AFFECT_DATA af_zero;
	OBJ_AFFECT_DATA *af;

	if (oaffect_free == nullptr)
	{
		af = new OBJ_AFFECT_DATA;
	}
	else
	{
		af = oaffect_free;
		oaffect_free = oaffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}